

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_avx.cpp
# Opt level: O1

int __thiscall ncnn::Convolution_x86_avx::create_pipeline(Convolution_x86_avx *this,Option *opt)

{
  undefined4 *puVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  uint uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  undefined4 uVar12;
  undefined4 uVar19;
  pointer pMVar13;
  pointer pMVar14;
  int *piVar15;
  void *pvVar16;
  Allocator *pAVar17;
  size_t sVar18;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [32];
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  Convolution_x86_avx *pCVar27;
  bool bVar28;
  bool bVar29;
  byte bVar30;
  uint uVar31;
  uint uVar32;
  Layer *pLVar33;
  _func_int **pp_Var34;
  undefined1 (*pauVar35) [32];
  byte bVar36;
  uint uVar37;
  long lVar38;
  byte bVar39;
  ulong uVar40;
  long lVar41;
  long lVar42;
  long lVar43;
  ulong uVar44;
  ulong uVar45;
  int iVar46;
  Option *pOVar47;
  undefined1 (*pauVar48) [32];
  int k;
  uint uVar49;
  ulong uVar50;
  int iVar51;
  undefined1 (*pauVar52) [32];
  uint uVar53;
  uint uVar54;
  _func_int **pp_Var55;
  long lVar56;
  undefined1 (*pauVar57) [16];
  uint uVar58;
  long lVar59;
  long lVar60;
  undefined1 (*pauVar61) [16];
  uint uVar62;
  _func_int **pp_Var63;
  _func_int **pp_Var64;
  long lVar65;
  int iVar66;
  uint uVar67;
  uint uVar68;
  long lVar69;
  long lVar70;
  long lVar71;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [32];
  undefined1 auVar75 [16];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  long lStack_290;
  undefined1 auStack_28c [4];
  ulong local_288;
  uint local_27c;
  _func_int **local_278;
  uint local_26c;
  Option *local_268;
  ulong local_260;
  ParamDict pd;
  uint uStack_244;
  int local_240;
  Allocator *local_238;
  int iStack_230;
  int iStack_22c;
  undefined8 uStack_228;
  int local_220 [2];
  size_t local_218;
  void *local_210;
  undefined4 uStack_208;
  undefined4 uStack_204;
  undefined4 uStack_200;
  undefined4 uStack_1fc;
  int iStack_1f8;
  Allocator *local_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  int local_1d8;
  size_t local_1d0;
  long local_1c8;
  Convolution_x86_avx *local_1c0;
  long local_1b8;
  long local_1b0;
  ParamDict pd_5;
  size_t local_198;
  int local_190;
  Allocator *local_188;
  int iStack_17c;
  undefined1 local_180 [16];
  int local_170;
  size_t local_168;
  int TILE_M;
  long local_138;
  long local_130;
  long local_128;
  undefined8 local_120;
  long local_118;
  uint local_10c;
  uint local_108;
  int TILE_K;
  long local_100;
  long local_f8;
  long local_f0;
  long local_e8;
  long local_e0;
  long local_d8;
  long local_d0;
  long local_c8;
  long local_c0;
  long local_b8;
  long local_b0;
  long local_a8;
  long local_a0;
  long local_98;
  long local_90;
  long local_88;
  Mat *local_80;
  long local_78;
  ulong local_70;
  long local_68;
  long local_60;
  long local_58;
  ulong local_50;
  ulong local_48;
  long local_40;
  int TILE_N;
  uint out_elempack;
  
  if ((this->super_Convolution).dynamic_weight != 0) {
    return 0;
  }
  switch((this->super_Convolution).activation_type) {
  case 1:
    lStack_290 = 0x202185;
    pLVar33 = create_layer_cpu(0x1a);
    lStack_290 = 0x202195;
    ParamDict::ParamDict(&pd);
    lStack_290 = 0x2021a1;
    (*pLVar33->_vptr_Layer[2])(pLVar33,&pd);
    break;
  case 2:
    lStack_290 = 0x202263;
    pLVar33 = create_layer_cpu(0x1a);
    lStack_290 = 0x202273;
    ParamDict::ParamDict(&pd);
    lStack_290 = 0x202288;
    ParamDict::set(&pd,0,*(this->super_Convolution).activation_params.data);
    lStack_290 = 0x202296;
    (*pLVar33->_vptr_Layer[2])(pLVar33,&pd);
    break;
  case 3:
    lStack_290 = 0x2021db;
    pLVar33 = create_layer_cpu(0x36);
    lStack_290 = 0x2021eb;
    ParamDict::ParamDict(&pd);
    lStack_290 = 0x202200;
    ParamDict::set(&pd,0,*(this->super_Convolution).activation_params.data);
    lStack_290 = 0x20221b;
    ParamDict::set(&pd,1,*(float *)((long)(this->super_Convolution).activation_params.data + 4));
    lStack_290 = 0x202229;
    (*pLVar33->_vptr_Layer[2])(pLVar33,&pd);
    break;
  case 4:
    lStack_290 = 0x202238;
    pLVar33 = create_layer_cpu(0x1e);
    lStack_290 = 0x202248;
    ParamDict::ParamDict(&pd);
    lStack_290 = 0x202254;
    (*pLVar33->_vptr_Layer[2])(pLVar33,&pd);
    break;
  case 5:
    lStack_290 = 0x2021b0;
    pLVar33 = create_layer_cpu(0x47);
    lStack_290 = 0x2021c0;
    ParamDict::ParamDict(&pd);
    lStack_290 = 0x2021cc;
    (*pLVar33->_vptr_Layer[2])(pLVar33,&pd);
    break;
  case 6:
    lStack_290 = 0x2022a2;
    pLVar33 = create_layer_cpu(0x43);
    lStack_290 = 0x2022b2;
    ParamDict::ParamDict(&pd);
    lStack_290 = 0x2022c7;
    ParamDict::set(&pd,0,*(this->super_Convolution).activation_params.data);
    lStack_290 = 0x2022e2;
    ParamDict::set(&pd,1,*(float *)((long)(this->super_Convolution).activation_params.data + 4));
    lStack_290 = 0x2022f0;
    (*pLVar33->_vptr_Layer[2])(pLVar33,&pd);
    break;
  default:
    pLVar33 = (Layer *)0x0;
    goto LAB_002022fa;
  }
  lStack_290 = 0x2022fa;
  ParamDict::~ParamDict(&pd);
LAB_002022fa:
  if (pLVar33 != (Layer *)0x0) {
    lStack_290 = 0x20230b;
    (*pLVar33->_vptr_Layer[4])(pLVar33,opt);
  }
  this->activation = pLVar33;
  this->nT = opt->num_threads;
  if ((opt->use_int8_inference == true) && ((this->super_Convolution).weight_data.elemsize == 1)) {
    lStack_290 = 0x202336;
    create_pipeline_int8_x86(this,opt);
    return 0;
  }
  uVar12 = (this->super_Convolution).kernel_w;
  uVar19 = (this->super_Convolution).kernel_h;
  auVar72._4_4_ = uVar19;
  auVar72._0_4_ = uVar12;
  uVar45 = (long)(this->super_Convolution).weight_data_size / (long)(int)(uVar19 * uVar12);
  uVar7 = (this->super_Convolution).num_output;
  uVar45 = (long)((ulong)(uint)((int)uVar45 >> 0x1f) << 0x20 | uVar45 & 0xffffffff) /
           (long)(int)uVar7;
  iVar51 = (int)uVar45;
  local_288 = CONCAT44(local_288._4_4_,iVar51);
  local_268 = opt;
  if (uVar12 == uVar19 && opt->use_packing_layout == false) {
    auVar20._0_4_ = (this->super_Convolution).dilation_w;
    auVar20._4_4_ = (this->super_Convolution).dilation_h;
    auVar20._8_4_ = (this->super_Convolution).stride_w;
    auVar20._12_4_ = (this->super_Convolution).stride_h;
    auVar73 = vshufps_avx(auVar20,auVar20,0x50);
    auVar75._8_4_ = 1;
    auVar75._0_8_ = 0x100000001;
    auVar75._12_4_ = 1;
    auVar73 = vblendps_avx(auVar75,auVar73,2);
    auVar75 = vpcmpeqd_avx(auVar75,auVar75);
    auVar20 = vpcmpeqd_avx(auVar20,auVar73);
    auVar20 = vpblendw_avx(auVar20,auVar20 ^ auVar75,3);
    auVar75 = auVar75 & ~auVar20;
    if ((((auVar75 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
         (auVar75 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar75 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar75[0xf]) {
      lStack_290 = 0x202712;
      pLVar33 = create_layer_cpu(6);
      this->convolution_dilation1 = pLVar33;
      lStack_290 = 0x202729;
      ParamDict::ParamDict(&pd_5);
      lStack_290 = 0x202739;
      ParamDict::set(&pd_5,0,(this->super_Convolution).num_output);
      lStack_290 = 0x202751;
      ParamDict::set(&pd_5,1,(this->super_Convolution).kernel_w);
      lStack_290 = 0x202769;
      ParamDict::set(&pd_5,0xb,(this->super_Convolution).kernel_h);
      lStack_290 = 0x202780;
      ParamDict::set(&pd_5,2,1);
      lStack_290 = 0x202797;
      ParamDict::set(&pd_5,0xc,1);
      lStack_290 = 0x2027ae;
      ParamDict::set(&pd_5,3,1);
      lStack_290 = 0x2027c5;
      ParamDict::set(&pd_5,0xd,1);
      lStack_290 = 0x2027d9;
      ParamDict::set(&pd_5,4,0);
      lStack_290 = 0x2027ed;
      ParamDict::set(&pd_5,0xe,0);
      lStack_290 = 0x202805;
      ParamDict::set(&pd_5,5,(this->super_Convolution).bias_term);
      lStack_290 = 0x20281d;
      ParamDict::set(&pd_5,6,(this->super_Convolution).weight_data_size);
      lStack_290 = 0x202832;
      (*this->convolution_dilation1->_vptr_Layer[2])(this->convolution_dilation1,&pd_5);
      if ((this->super_Convolution).bias_term == 0) {
        local_218 = 0;
        pd._vptr_ParamDict = (_func_int **)0x0;
        pd.d._0_4_ = 0;
        pd.d._4_4_ = 0;
        uStack_244 = 0;
        local_240 = 0;
        local_238 = (Allocator *)0x0;
        iStack_230 = 0;
        uStack_228 = SUB128(ZEXT812(0),4);
        local_220[0] = 0;
        iStack_22c = pd.d._4_4_;
        if ((Mat *)&pd != &(this->super_Convolution).weight_data) {
          piVar15 = (this->super_Convolution).weight_data.refcount;
          if (piVar15 != (int *)0x0) {
            LOCK();
            *piVar15 = *piVar15 + 1;
            UNLOCK();
          }
          pd._vptr_ParamDict = (_func_int **)(this->super_Convolution).weight_data.data;
          piVar15 = (this->super_Convolution).weight_data.refcount;
          pd.d._0_4_ = SUB84(piVar15,0);
          pd.d._4_4_ = (int)((ulong)piVar15 >> 0x20);
          uStack_244 = (uint)((this->super_Convolution).weight_data.elemsize >> 0x20);
          local_240 = (this->super_Convolution).weight_data.elempack;
          local_238 = (this->super_Convolution).weight_data.allocator;
          uVar25 = (this->super_Convolution).weight_data.dims;
          uVar26 = (this->super_Convolution).weight_data.w;
          uStack_228._0_4_ = (this->super_Convolution).weight_data.h;
          uStack_228._4_4_ = (this->super_Convolution).weight_data.d;
          local_220[0] = (this->super_Convolution).weight_data.c;
          local_218 = (this->super_Convolution).weight_data.cstep;
          iStack_230 = uVar25;
          iStack_22c = uVar26;
        }
        pLVar33 = this->convolution_dilation1;
        lStack_290 = 0x203fb4;
        ModelBinFromMatArray::ModelBinFromMatArray((ModelBinFromMatArray *)&TILE_M,(Mat *)&pd);
        lStack_290 = 0x203fc5;
        (*pLVar33->_vptr_Layer[3])(pLVar33,&TILE_M);
        lStack_290 = 0x203fd2;
        ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)&TILE_M);
        piVar15 = (int *)CONCAT44(pd.d._4_4_,pd.d._0_4_);
        if (piVar15 != (int *)0x0) {
          LOCK();
          *piVar15 = *piVar15 + -1;
          UNLOCK();
          if (*piVar15 == 0) {
            if (local_238 == (Allocator *)0x0) {
              if (pd._vptr_ParamDict != (_func_int **)0x0) {
                lStack_290 = 0x204014;
                free(pd._vptr_ParamDict);
              }
            }
            else {
              lStack_290 = 0x203ffe;
              (*local_238->_vptr_Allocator[3])();
            }
          }
        }
      }
      else {
        lVar69 = 0x40;
        auVar73._0_12_ = ZEXT812(0);
        auVar73._12_4_ = 0;
        do {
          *(undefined8 *)((long)&pd._vptr_ParamDict + lVar69) = 0;
          *(undefined1 (*) [16])(&stack0xfffffffffffffd68 + lVar69) = auVar73;
          *(undefined1 (*) [16])(auStack_28c + lVar69) = auVar73;
          *(undefined1 (*) [16])((long)&local_278 + lVar69) = auVar73;
          *(undefined1 (*) [16])((long)&local_26c + lVar69) = auVar73;
          lVar69 = lVar69 + 0x48;
        } while (lVar69 != 0xd0);
        if ((Mat *)&pd != &(this->super_Convolution).weight_data) {
          piVar15 = (this->super_Convolution).weight_data.refcount;
          if (piVar15 != (int *)0x0) {
            LOCK();
            *piVar15 = *piVar15 + 1;
            UNLOCK();
          }
          piVar15 = (int *)CONCAT44(pd.d._4_4_,pd.d._0_4_);
          if (piVar15 != (int *)0x0) {
            LOCK();
            *piVar15 = *piVar15 + -1;
            UNLOCK();
            if (*piVar15 == 0) {
              if (local_238 == (Allocator *)0x0) {
                if (pd._vptr_ParamDict != (_func_int **)0x0) {
                  lStack_290 = 0x203c2a;
                  free(pd._vptr_ParamDict);
                }
              }
              else {
                lStack_290 = 0x2028c9;
                (*local_238->_vptr_Allocator[3])();
              }
            }
          }
          pd._vptr_ParamDict = (_func_int **)(this->super_Convolution).weight_data.data;
          piVar15 = (this->super_Convolution).weight_data.refcount;
          pd.d._0_4_ = SUB84(piVar15,0);
          pd.d._4_4_ = (int)((ulong)piVar15 >> 0x20);
          uStack_244 = (uint)((this->super_Convolution).weight_data.elemsize >> 0x20);
          local_240 = (this->super_Convolution).weight_data.elempack;
          local_238 = (this->super_Convolution).weight_data.allocator;
          uVar23 = (this->super_Convolution).weight_data.dims;
          uVar24 = (this->super_Convolution).weight_data.w;
          uStack_228._0_4_ = (this->super_Convolution).weight_data.h;
          uStack_228._4_4_ = (this->super_Convolution).weight_data.d;
          local_220[0] = (this->super_Convolution).weight_data.c;
          local_218 = (this->super_Convolution).weight_data.cstep;
          iStack_230 = uVar23;
          iStack_22c = uVar24;
        }
        if ((Mat *)&local_210 != &(this->super_Convolution).bias_data) {
          piVar15 = (this->super_Convolution).bias_data.refcount;
          if (piVar15 != (int *)0x0) {
            LOCK();
            *piVar15 = *piVar15 + 1;
            UNLOCK();
          }
          piVar15 = (int *)CONCAT44(uStack_204,uStack_208);
          if (piVar15 != (int *)0x0) {
            LOCK();
            *piVar15 = *piVar15 + -1;
            UNLOCK();
            if (*piVar15 == 0) {
              if (local_1f0 == (Allocator *)0x0) {
                if (local_210 != (void *)0x0) {
                  lStack_290 = 0x203d02;
                  free(local_210);
                }
              }
              else {
                lStack_290 = 0x203cf3;
                (*local_1f0->_vptr_Allocator[3])();
              }
            }
          }
          local_210 = (this->super_Convolution).bias_data.data;
          piVar15 = (this->super_Convolution).bias_data.refcount;
          uStack_208 = SUB84(piVar15,0);
          uStack_204 = (undefined4)((ulong)piVar15 >> 0x20);
          sVar18 = (this->super_Convolution).bias_data.elemsize;
          uStack_200 = (undefined4)sVar18;
          uStack_1fc = (undefined4)(sVar18 >> 0x20);
          iStack_1f8 = (this->super_Convolution).bias_data.elempack;
          local_1f0 = (this->super_Convolution).bias_data.allocator;
          local_1e8._0_4_ = (this->super_Convolution).bias_data.dims;
          local_1e8._4_4_ = (this->super_Convolution).bias_data.w;
          uStack_1e0._0_4_ = (this->super_Convolution).bias_data.h;
          uStack_1e0._4_4_ = (this->super_Convolution).bias_data.d;
          local_1d8 = (this->super_Convolution).bias_data.c;
          local_1d0 = (this->super_Convolution).bias_data.cstep;
        }
        pLVar33 = this->convolution_dilation1;
        lStack_290 = 0x203dae;
        ModelBinFromMatArray::ModelBinFromMatArray((ModelBinFromMatArray *)&TILE_M,(Mat *)&pd);
        lStack_290 = 0x203dbf;
        (*pLVar33->_vptr_Layer[3])(pLVar33,&TILE_M);
        lStack_290 = 0x203dcc;
        ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)&TILE_M);
        lVar69 = 0x48;
        do {
          piVar15 = *(int **)((long)&pd.d + lVar69);
          if (piVar15 != (int *)0x0) {
            LOCK();
            *piVar15 = *piVar15 + -1;
            UNLOCK();
            if (*piVar15 == 0) {
              pvVar16 = *(void **)((long)&pd._vptr_ParamDict + lVar69);
              if (*(long **)((long)&local_238 + lVar69) == (long *)0x0) {
                if (pvVar16 != (void *)0x0) {
                  lStack_290 = 0x203e0c;
                  free(pvVar16);
                }
              }
              else {
                lStack_290 = 0x203df9;
                (**(code **)(**(long **)((long)&local_238 + lVar69) + 0x18))();
              }
            }
          }
          *(undefined8 *)((long)&local_218 + lVar69) = 0;
          *(undefined8 *)((long)&pd.d + lVar69 + 4) = 0;
          *(undefined8 *)((long)&uStack_244 + lVar69) = 0;
          *(undefined8 *)((long)&pd._vptr_ParamDict + lVar69) = 0;
          *(undefined8 *)((long)&pd.d + lVar69) = 0;
          *(undefined8 *)((long)&iStack_230 + lVar69) = 0;
          *(undefined8 *)((long)local_220 + lVar69 + -8) = 0;
          *(undefined4 *)((long)local_220 + lVar69) = 0;
          lVar69 = lVar69 + -0x48;
          opt = local_268;
        } while (lVar69 != -0x48);
      }
      lStack_290 = 0x203e54;
      (*this->convolution_dilation1->_vptr_Layer[4])(this->convolution_dilation1,opt);
      if (opt->lightmode == true) {
        piVar15 = (this->super_Convolution).weight_data.refcount;
        if (piVar15 != (int *)0x0) {
          LOCK();
          *piVar15 = *piVar15 + -1;
          UNLOCK();
          if (*piVar15 == 0) {
            pvVar16 = (this->super_Convolution).weight_data.data;
            pAVar17 = (this->super_Convolution).weight_data.allocator;
            if (pAVar17 == (Allocator *)0x0) {
              if (pvVar16 != (void *)0x0) {
                lStack_290 = 0x203e92;
                free(pvVar16);
              }
            }
            else {
              lStack_290 = 0x203e83;
              (*pAVar17->_vptr_Allocator[3])();
            }
          }
        }
        (this->super_Convolution).weight_data.cstep = 0;
        *(undefined8 *)((long)&(this->super_Convolution).weight_data.refcount + 4) = 0;
        *(undefined8 *)((long)&(this->super_Convolution).weight_data.elemsize + 4) = 0;
        (this->super_Convolution).weight_data.data = (void *)0x0;
        (this->super_Convolution).weight_data.refcount = (int *)0x0;
        (this->super_Convolution).weight_data.dims = 0;
        (this->super_Convolution).weight_data.w = 0;
        (this->super_Convolution).weight_data.h = 0;
        (this->super_Convolution).weight_data.d = 0;
        (this->super_Convolution).weight_data.c = 0;
      }
      lStack_290 = 0x203ed0;
      ParamDict::~ParamDict(&pd_5);
      return 0;
    }
  }
  uVar68 = 1;
  lVar69 = 1;
  if (opt->use_packing_layout != false) {
    uVar68 = (uint)((uVar45 & 3) == 0) * 3 + 1;
    if ((uVar45 & 7) == 0) {
      uVar68 = 8;
    }
    lVar69 = (ulong)((uVar7 & 3) == 0) * 3 + 1;
    if ((uVar7 & 7) == 0) {
      lVar69 = 8;
    }
  }
  if (((opt->use_winograd23_convolution == false) && (opt->use_winograd43_convolution == false)) &&
     (opt->use_winograd63_convolution != true)) {
    bVar28 = false;
  }
  else {
    bVar28 = 8 < (int)uVar7 || 8 < iVar51;
  }
  auVar21._0_4_ = (this->super_Convolution).dilation_w;
  auVar21._4_4_ = (this->super_Convolution).dilation_h;
  auVar21._8_4_ = (this->super_Convolution).stride_w;
  auVar21._12_4_ = (this->super_Convolution).stride_h;
  auVar72._8_8_ = 0;
  auVar72 = vpunpcklqdq_avx(auVar72,auVar21);
  if (((auVar72 != _DAT_005f1480) || ((this->super_Convolution).stride_w != 1)) ||
     (((this->super_Convolution).stride_h != 1 ||
      ((opt->use_winograd_convolution == false || (!bVar28)))))) {
    lStack_290 = 0x202503;
    iVar66 = get_cpu_level2_cache_size();
    pOVar47 = local_268;
    uVar7 = (this->super_Convolution).num_output;
    uVar49 = (this->super_Convolution).kernel_w;
    uVar67 = (this->super_Convolution).kernel_h;
    uVar32 = (this->super_Convolution).dilation_w;
    uVar37 = (this->super_Convolution).dilation_h;
    iVar51 = (this->super_Convolution).stride_w;
    iVar46 = (this->super_Convolution).stride_h;
    local_1c0 = this;
    if (((local_268->use_sgemm_convolution == true) &&
        (iVar66 < (int)(uVar7 * uVar49 * uVar67 * uVar32 * uVar37 * iVar51 * iVar46 * (int)local_288
                       * 8) || (0x10 < (int)local_288 || 0x10 < (int)uVar7))) ||
       (uVar67 == 1 && uVar49 == 1)) {
      uVar67 = uVar67 * uVar49;
      local_260 = (ulong)(uVar67 * (int)local_288);
      convolution_im2col_gemm_get_optimal_tile_mnk
                (uVar7,0,uVar67 * (int)local_288,&TILE_M,&TILE_N,&TILE_K,local_268->num_threads);
      uVar68 = (int)(TILE_M + uVar7 + -1) / TILE_M;
      uVar49 = 1;
      if (pOVar47->use_packing_layout == true) {
        uVar49 = 8;
        if ((local_288 & 7) != 0) {
          uVar49 = (uint)((local_288 & 3) == 0) * 3 + 1;
        }
      }
      local_80 = &(this->super_Convolution).weight_data;
      local_218 = 0;
      pd._vptr_ParamDict = (_func_int **)0x0;
      pd.d._0_4_ = 0;
      pd.d._4_4_ = 0;
      uStack_244 = 0;
      local_240 = 0;
      local_238 = (Allocator *)0x0;
      iStack_230 = 0;
      iStack_22c = 0;
      uStack_228._0_4_ = 0;
      uStack_228._4_4_ = 0;
      local_220[0] = 0;
      if (uVar67 == 1) {
        lStack_290 = 0x202677;
        Mat::reshape((Mat *)&pd_5,local_80,(int)local_260,uVar7,(Allocator *)0x0);
        piVar15 = (int *)CONCAT44(pd_5.d._4_4_,pd_5.d._0_4_);
        if (piVar15 != (int *)0x0) {
          LOCK();
          *piVar15 = *piVar15 + 1;
          UNLOCK();
        }
        piVar15 = (int *)CONCAT44(pd.d._4_4_,pd.d._0_4_);
        if (piVar15 != (int *)0x0) {
          LOCK();
          *piVar15 = *piVar15 + -1;
          UNLOCK();
          if (*piVar15 == 0) {
            if (local_238 == (Allocator *)0x0) {
              if (pd._vptr_ParamDict != (_func_int **)0x0) {
                lStack_290 = 0x202df9;
                free(pd._vptr_ParamDict);
              }
            }
            else {
              lStack_290 = 0x2026b7;
              (*local_238->_vptr_Allocator[3])();
            }
          }
        }
        piVar15 = (int *)CONCAT44(pd_5.d._4_4_,pd_5.d._0_4_);
        pd._vptr_ParamDict = pd_5._vptr_ParamDict;
        pd.d._0_4_ = pd_5.d._0_4_;
        pd.d._4_4_ = pd_5.d._4_4_;
        uStack_244 = (uint)(local_198 >> 0x20);
        local_240 = local_190;
        local_238 = local_188;
        iStack_230 = local_180._0_4_;
        uStack_228 = local_180._8_8_;
        local_220[0] = local_170;
        local_218 = local_168;
        iStack_22c = iStack_17c;
        if (piVar15 != (int *)0x0) {
          LOCK();
          *piVar15 = *piVar15 + -1;
          UNLOCK();
          if (*piVar15 == 0) {
            if (local_188 == (Allocator *)0x0) {
              if (pd_5._vptr_ParamDict != (_func_int **)0x0) {
                lStack_290 = 0x202ebd;
                free(pd_5._vptr_ParamDict);
              }
            }
            else {
              lStack_290 = 0x202eaa;
              (*local_188->_vptr_Allocator[3])();
            }
          }
        }
        pd_5._vptr_ParamDict = (_func_int **)0x0;
        pd_5.d._0_4_ = 0;
        pd_5.d._4_4_ = 0;
      }
      else {
        lStack_290 = 0x2028e7;
        Mat::reshape((Mat *)&pd_5,local_80,uVar67,(int)local_288,uVar7,(Allocator *)0x0);
        lStack_290 = 0x202906;
        local_27c = uVar68;
        Mat::create((Mat *)&pd,(int)local_260,uVar7,4,(Allocator *)0x0);
        this = local_1c0;
        uVar68 = local_27c;
        if (0 < (int)uVar7) {
          local_278 = pd._vptr_ParamDict;
          local_1c8 = (long)iStack_22c * ((ulong)uStack_244 << 0x20);
          uVar45 = (ulong)uVar49;
          uVar44 = 0;
          do {
            if ((int)uVar49 <= (int)local_288) {
              pp_Var34 = (_func_int **)(local_198 * local_168 * uVar44 + (long)pd_5._vptr_ParamDict)
              ;
              pp_Var55 = (_func_int **)(local_1c8 * uVar44 + (long)pd._vptr_ParamDict);
              lVar69 = 0;
              do {
                if (0 < (int)uVar67) {
                  uVar50 = 0;
                  uVar40 = uVar45;
                  pp_Var64 = pp_Var34;
                  pp_Var63 = pp_Var34;
                  do {
                    do {
                      *(undefined4 *)pp_Var55 = *(undefined4 *)pp_Var64;
                      pp_Var55 = (_func_int **)((long)pp_Var55 + 4);
                      uVar40 = uVar40 - 1;
                      pp_Var64 = (_func_int **)((long)pp_Var64 + (long)iStack_17c * local_198);
                    } while (uVar40 != 0);
                    uVar50 = uVar50 + 1;
                    pp_Var64 = (_func_int **)((long)pp_Var63 + 4);
                    uVar40 = uVar45;
                    pp_Var63 = pp_Var64;
                  } while (uVar50 != uVar67);
                }
                lVar69 = lVar69 + uVar45;
                pp_Var34 = (_func_int **)((long)pp_Var34 + (long)iStack_17c * local_198 * uVar45);
              } while (lVar69 < (long)((long)(int)local_288 - (ulong)(uVar49 - 1)));
            }
            uVar44 = uVar44 + 1;
          } while (uVar44 != uVar7);
        }
        piVar15 = (int *)CONCAT44(pd_5.d._4_4_,pd_5.d._0_4_);
        if (piVar15 != (int *)0x0) {
          LOCK();
          *piVar15 = *piVar15 + -1;
          UNLOCK();
          if (*piVar15 == 0) {
            if (local_188 == (Allocator *)0x0) {
              if (pd_5._vptr_ParamDict != (_func_int **)0x0) {
                lStack_290 = 0x203bd1;
                free(pd_5._vptr_ParamDict);
              }
            }
            else {
              lStack_290 = 0x202a23;
              (*local_188->_vptr_Allocator[3])();
            }
          }
        }
      }
      local_128 = (long)TILE_K;
      lVar69 = (long)TILE_M;
      lStack_290 = 0x202f3a;
      Mat::create(&this->weight_sgemm_data,TILE_M * TILE_K,((int)local_260 + TILE_K + -1) / TILE_K,
                  (int)((uVar7 - 1) + TILE_M) / TILE_M,4,(Allocator *)0x0);
      pCVar27 = local_1c0;
      if (0 < (int)uVar68) {
        local_58 = (long)(int)local_260;
        local_70 = (ulong)uVar68;
        local_60 = local_128 * 4;
        local_78 = lVar69 * 4;
        local_b8 = 4;
        local_c0 = 8;
        local_c8 = 0xc;
        local_d0 = 0x10;
        local_d8 = 0x14;
        local_e0 = 0x18;
        local_e8 = 0x1c;
        local_f0 = 3;
        local_f8 = 2;
        local_130 = 1;
        local_138 = 0;
        local_100 = 0;
        uVar45 = 0;
        do {
          local_1c8 = uVar45 * lVar69;
          local_26c = uVar7 - (int)local_1c8;
          if (TILE_M < (int)local_26c) {
            local_26c = TILE_M;
          }
          if (0 < (int)local_260) {
            local_48 = (ulong)local_26c;
            local_288 = (ulong)(int)local_26c;
            local_1b8 = 0;
            uVar44 = local_260;
            pp_Var34 = (_func_int **)0x0;
            do {
              local_278 = pp_Var34;
              uVar68 = (uint)local_128;
              local_10c = (uint)uVar44;
              local_27c = local_10c;
              if ((int)uVar68 < (int)local_10c) {
                local_27c = uVar68;
              }
              uVar49 = (int)local_260 - (int)local_278;
              if ((int)uVar68 < (int)uVar49) {
                uVar49 = uVar68;
              }
              sVar18 = (local_1c0->weight_sgemm_data).elemsize;
              pauVar48 = (undefined1 (*) [32])
                         ((long)(local_1c0->weight_sgemm_data).data +
                         (long)(local_1c0->weight_sgemm_data).w * sVar18 *
                         (long)(int)((long)((ulong)(uint)((int)local_278 >> 0x1f) << 0x20 |
                                           (ulong)local_278 & 0xffffffff) / (long)(int)uVar68) +
                         (local_1c0->weight_sgemm_data).cstep * uVar45 * sVar18);
              uVar44 = 0;
              local_88 = (long)iStack_22c;
              if (7 < (int)local_26c) {
                local_108 = uVar49 & 0xfffffff8;
                local_40 = local_88 * 0x20;
                lVar59 = local_b8 * local_88 + local_1b8;
                local_90 = local_c8 * local_88 + local_1b8;
                local_98 = local_d0 * local_88 + local_1b8;
                local_a0 = local_d8 * local_88 + local_1b8;
                local_a8 = local_e0 * local_88 + local_1b8;
                local_b0 = local_e8 * local_88 + local_1b8;
                lVar56 = local_100 * local_88 + local_1b8;
                uVar44 = 0;
                lVar65 = local_c0 * local_88 + local_1b8;
                do {
                  local_118 = lVar65;
                  local_120 = uVar44;
                  local_1b0 = lVar56;
                  if ((int)uVar49 < 8) {
                    lVar56 = (long)local_278 * 4 + (local_120 + local_1c8) * local_88 * 4;
                    lVar65 = (long)local_278 * 4 + (local_120 + local_1c8 + 1) * local_88 * 4;
                    lVar38 = (long)local_278 * 4 + (local_120 + local_1c8 + 2) * local_88 * 4;
                    lVar60 = (long)local_278 * 4 + (local_120 + local_1c8 + 3) * local_88 * 4;
                    lVar71 = (long)local_278 * 4 + (local_120 + local_1c8 + 4) * local_88 * 4;
                    lVar70 = (long)local_278 * 4 + (local_120 + local_1c8 + 5) * local_88 * 4;
                    lVar43 = (long)local_278 * 4 + (local_120 + local_1c8 + 6) * local_88 * 4;
                    lVar41 = (long)local_278 * 4 + (local_120 + local_1c8 + 7) * local_88 * 4;
                    uVar67 = 0;
                  }
                  else {
                    iVar51 = 7;
                    lVar41 = 0;
                    pauVar52 = pauVar48;
                    do {
                      pauVar35 = pauVar52;
                      pauVar52 = (undefined1 (*) [32])((long)*pauVar48 + lVar41 * 2 * 4);
                      lVar56 = lVar41 + local_1b0;
                      auVar2 = *(undefined1 (*) [32])((long)pd._vptr_ParamDict + lVar41 + local_1b0)
                      ;
                      lVar65 = local_88 * 8 + lVar56;
                      auVar74 = *(undefined1 (*) [32])
                                 ((long)pd._vptr_ParamDict + local_88 * 4 + lVar56);
                      auVar76 = *(undefined1 (*) [32])
                                 ((long)pd._vptr_ParamDict + local_88 * 8 + lVar56);
                      auVar3 = *(undefined1 (*) [32])
                                ((long)pd._vptr_ParamDict + local_88 * 4 + lVar65);
                      lVar56 = local_88 * 8 + lVar65;
                      auVar4 = *(undefined1 (*) [32])
                                ((long)pd._vptr_ParamDict + local_88 * 8 + lVar65);
                      lVar65 = local_88 * 4 + lVar56;
                      auVar77 = *(undefined1 (*) [32])
                                 ((long)pd._vptr_ParamDict + local_88 * 4 + lVar56);
                      auVar5 = *(undefined1 (*) [32])
                                ((long)pd._vptr_ParamDict + local_88 * 4 + lVar65);
                      auVar6 = *(undefined1 (*) [32])
                                ((long)pd._vptr_ParamDict + local_88 * 8 + lVar65);
                      auVar22 = vunpcklps_avx(auVar2,auVar74);
                      auVar74 = vunpckhps_avx(auVar2,auVar74);
                      auVar2 = vunpcklps_avx(auVar76,auVar3);
                      auVar76 = vunpckhps_avx(auVar76,auVar3);
                      auVar78 = vunpcklps_avx(auVar4,auVar77);
                      auVar3 = vunpckhps_avx(auVar4,auVar77);
                      auVar79 = vunpcklps_avx(auVar5,auVar6);
                      auVar4 = vunpckhps_avx(auVar5,auVar6);
                      auVar77 = vunpcklpd_avx(auVar22,auVar2);
                      auVar2 = vunpckhpd_avx(auVar22,auVar2);
                      auVar5 = vunpcklpd_avx(auVar74,auVar76);
                      auVar74 = vunpckhpd_avx(auVar74,auVar76);
                      auVar6 = vunpcklpd_avx(auVar78,auVar79);
                      auVar76 = vunpckhpd_avx(auVar78,auVar79);
                      auVar22 = vunpcklpd_avx(auVar3,auVar4);
                      auVar3 = vunpckhpd_avx(auVar3,auVar4);
                      auVar78._16_16_ = auVar6._0_16_;
                      auVar78._0_16_ = auVar77._0_16_;
                      auVar79._16_16_ = auVar76._0_16_;
                      auVar79._0_16_ = auVar2._0_16_;
                      auVar80._16_16_ = auVar22._0_16_;
                      auVar80._0_16_ = auVar5._0_16_;
                      auVar81._16_16_ = auVar3._0_16_;
                      auVar81._0_16_ = auVar74._0_16_;
                      auVar4 = vperm2f128_avx(auVar77,auVar6,0x31);
                      auVar2 = vperm2f128_avx(auVar2,auVar76,0x31);
                      auVar76 = vperm2f128_avx(auVar5,auVar22,0x31);
                      auVar74 = vperm2f128_avx(auVar74,auVar3,0x31);
                      *pauVar52 = auVar78;
                      pauVar52[1] = auVar79;
                      pauVar52[2] = auVar80;
                      pauVar52[3] = auVar81;
                      pauVar52[4] = auVar4;
                      pauVar52[5] = auVar2;
                      pauVar52[6] = auVar76;
                      pauVar52[7] = auVar74;
                      lVar41 = lVar41 + 0x20;
                      iVar51 = iVar51 + 8;
                      pauVar52 = pauVar52 + 8;
                    } while (iVar51 < (int)uVar49);
                    pauVar48 = pauVar35 + 8;
                    lVar56 = lVar41 + local_1b0;
                    lVar65 = lVar41 + lVar59;
                    lVar38 = lVar41 + local_118;
                    lVar60 = lVar41 + local_90;
                    lVar71 = lVar41 + local_98;
                    lVar70 = lVar41 + local_a0;
                    lVar43 = lVar41 + local_a8;
                    lVar41 = lVar41 + local_b0;
                    uVar67 = local_108;
                  }
                  if ((int)uVar67 < (int)uVar49) {
                    iVar51 = local_27c - uVar67;
                    lVar42 = 0;
                    pauVar52 = pauVar48;
                    do {
                      pauVar35 = pauVar52;
                      puVar1 = (undefined4 *)((long)*pauVar48 + lVar42 * 2 * 4);
                      *puVar1 = *(undefined4 *)((long)pd._vptr_ParamDict + lVar42 + lVar56);
                      puVar1[1] = *(undefined4 *)((long)pd._vptr_ParamDict + lVar42 + lVar65);
                      puVar1[2] = *(undefined4 *)((long)pd._vptr_ParamDict + lVar42 + lVar38);
                      puVar1[3] = *(undefined4 *)((long)pd._vptr_ParamDict + lVar42 + lVar60);
                      puVar1[4] = *(undefined4 *)((long)pd._vptr_ParamDict + lVar42 + lVar71);
                      puVar1[5] = *(undefined4 *)((long)pd._vptr_ParamDict + lVar42 + lVar70);
                      puVar1[6] = *(undefined4 *)((long)pd._vptr_ParamDict + lVar42 + lVar43);
                      puVar1[7] = *(undefined4 *)((long)pd._vptr_ParamDict + lVar42 + lVar41);
                      lVar42 = lVar42 + 4;
                      iVar51 = iVar51 + -1;
                      pauVar52 = (undefined1 (*) [32])(puVar1 + 8);
                    } while (iVar51 != 0);
                    pauVar48 = pauVar35 + 1;
                  }
                  uVar44 = local_120 + 8;
                  lVar59 = lVar59 + local_40;
                  local_90 = local_90 + local_40;
                  local_98 = local_98 + local_40;
                  local_a0 = local_a0 + local_40;
                  local_a8 = local_a8 + local_40;
                  local_b0 = local_b0 + local_40;
                  lVar56 = local_1b0 + local_40;
                  lVar65 = local_118 + local_40;
                } while (local_120 + 0xf < local_48);
              }
              if ((int)((uint)uVar44 | 3) < (int)local_26c) {
                local_120 = CONCAT44(local_120._4_4_,uVar49) & 0xfffffffffffffff8;
                uVar40 = uVar44 & 0xffffffff;
                lVar56 = local_1b8 + (local_138 + uVar40) * local_88 * 4;
                lVar60 = local_88 * 0x10;
                lVar65 = local_1b8 + (local_f0 + uVar40) * local_88 * 4;
                lVar59 = local_1b8 + (local_130 + uVar40) * local_88 * 4;
                lVar38 = local_1b8 + (local_f8 + uVar40) * local_88 * 4;
                do {
                  local_1b0 = lVar38;
                  if ((int)uVar49 < 8) {
                    uVar67 = 0;
                    lVar38 = (long)local_278 * 4 + (uVar40 + local_1c8) * local_88 * 4;
                    lVar43 = (long)local_278 * 4 + (uVar40 + local_1c8 + 1) * local_88 * 4;
                    lVar70 = (long)local_278 * 4 + (uVar40 + local_1c8 + 2) * local_88 * 4;
                    lVar71 = (long)local_278 * 4 + (uVar40 + local_1c8 + 3) * local_88 * 4;
                    local_118 = lVar65;
                  }
                  else {
                    iVar51 = 7;
                    lVar43 = 0;
                    pauVar52 = pauVar48;
                    do {
                      pauVar35 = pauVar52;
                      pauVar52 = (undefined1 (*) [32])((long)*pauVar48 + lVar43 * 4);
                      auVar2 = *(undefined1 (*) [32])((long)pd._vptr_ParamDict + lVar43 + lVar56);
                      auVar74 = *(undefined1 (*) [32])((long)pd._vptr_ParamDict + lVar43 + lVar59);
                      auVar76 = *(undefined1 (*) [32])
                                 ((long)pd._vptr_ParamDict + lVar43 + local_1b0);
                      auVar3 = *(undefined1 (*) [32])((long)pd._vptr_ParamDict + lVar43 + lVar65);
                      auVar4 = vunpcklps_avx(auVar2,auVar74);
                      auVar74 = vunpckhps_avx(auVar2,auVar74);
                      auVar2 = vunpcklps_avx(auVar76,auVar3);
                      auVar76 = vunpckhps_avx(auVar76,auVar3);
                      auVar3 = vunpcklpd_avx(auVar4,auVar2);
                      auVar2 = vunpckhpd_avx(auVar4,auVar2);
                      auVar4 = vunpcklpd_avx(auVar74,auVar76);
                      auVar74 = vunpckhpd_avx(auVar74,auVar76);
                      auVar76._16_16_ = auVar2._0_16_;
                      auVar76._0_16_ = auVar3._0_16_;
                      auVar77._16_16_ = auVar74._0_16_;
                      auVar77._0_16_ = auVar4._0_16_;
                      auVar2 = vperm2f128_avx(auVar3,auVar2,0x31);
                      auVar74 = vperm2f128_avx(auVar4,auVar74,0x31);
                      *pauVar52 = auVar76;
                      pauVar52[1] = auVar77;
                      pauVar52[2] = auVar2;
                      pauVar52[3] = auVar74;
                      lVar43 = lVar43 + 0x20;
                      iVar51 = iVar51 + 8;
                      pauVar52 = pauVar52 + 4;
                    } while (iVar51 < (int)uVar49);
                    pauVar48 = pauVar35 + 4;
                    lVar38 = lVar43 + lVar56;
                    lVar71 = lVar43 + lVar65;
                    lVar70 = lVar43 + local_1b0;
                    lVar43 = lVar43 + lVar59;
                    uVar67 = (uint)local_120;
                  }
                  lVar71 = (long)pd._vptr_ParamDict + lVar71;
                  lVar70 = (long)pd._vptr_ParamDict + lVar70;
                  lVar43 = (long)pd._vptr_ParamDict + lVar43;
                  lVar38 = (long)pd._vptr_ParamDict + lVar38;
                  if ((int)(uVar67 | 3) < (int)uVar49) {
                    lVar41 = 0;
                    pauVar52 = pauVar48;
                    uVar32 = uVar67;
                    do {
                      pauVar35 = pauVar52;
                      auVar20 = vunpcklps_avx(*(undefined1 (*) [16])(lVar38 + lVar41),
                                              *(undefined1 (*) [16])(lVar43 + lVar41));
                      auVar73 = vunpcklps_avx(*(undefined1 (*) [16])(lVar70 + lVar41),
                                              *(undefined1 (*) [16])(lVar71 + lVar41));
                      auVar75 = vunpckhps_avx(*(undefined1 (*) [16])(lVar38 + lVar41),
                                              *(undefined1 (*) [16])(lVar43 + lVar41));
                      auVar21 = vunpckhps_avx(*(undefined1 (*) [16])(lVar70 + lVar41),
                                              *(undefined1 (*) [16])(lVar71 + lVar41));
                      auVar72 = vmovlhps_avx(auVar20,auVar73);
                      auVar73 = vunpckhpd_avx(auVar20,auVar73);
                      auVar20 = vmovlhps_avx(auVar75,auVar21);
                      auVar75 = vunpckhpd_avx(auVar75,auVar21);
                      pauVar52 = (undefined1 (*) [32])((long)pauVar48[2] + lVar41 * 4);
                      *(undefined1 (*) [16])pauVar52[-2] = auVar72;
                      *(undefined1 (*) [16])((long)pauVar52[-2] + 0x10) = auVar73;
                      *(undefined1 (*) [16])pauVar52[-1] = auVar20;
                      *(undefined1 (*) [16])((long)pauVar52[-1] + 0x10) = auVar75;
                      uVar67 = uVar32 + 4;
                      lVar41 = lVar41 + 0x10;
                      iVar51 = uVar32 + 7;
                      uVar32 = uVar67;
                    } while (iVar51 < (int)uVar49);
                    pauVar48 = pauVar35 + 2;
                    lVar38 = lVar38 + lVar41;
                    lVar71 = lVar71 + lVar41;
                    lVar70 = lVar70 + lVar41;
                    lVar43 = lVar43 + lVar41;
                  }
                  if ((int)uVar67 < (int)uVar49) {
                    lVar41 = 0;
                    do {
                      *(undefined4 *)*pauVar48 = *(undefined4 *)(lVar38 + lVar41 * 4);
                      *(undefined4 *)((long)*pauVar48 + 4) = *(undefined4 *)(lVar43 + lVar41 * 4);
                      *(undefined4 *)((long)*pauVar48 + 8) = *(undefined4 *)(lVar70 + lVar41 * 4);
                      *(undefined4 *)((long)*pauVar48 + 0xc) = *(undefined4 *)(lVar71 + lVar41 * 4);
                      pauVar48 = (undefined1 (*) [32])((long)*pauVar48 + 0x10);
                      lVar41 = lVar41 + 1;
                    } while (local_27c - uVar67 != (int)lVar41);
                  }
                  uVar44 = uVar40 + 4;
                  lVar71 = uVar40 + 7;
                  lVar56 = lVar56 + lVar60;
                  lVar65 = lVar65 + lVar60;
                  lVar59 = lVar59 + lVar60;
                  lVar38 = local_1b0 + lVar60;
                  uVar40 = uVar44;
                } while (lVar71 < (long)local_288);
              }
              if ((int)((uint)uVar44 | 1) < (int)local_26c) {
                uVar40 = uVar44 & 0xffffffff;
                lVar56 = local_1b8 + (local_130 + uVar40) * local_88 * 4;
                lVar65 = local_1b8 + (local_138 + uVar40) * local_88 * 4;
                do {
                  if ((int)uVar49 < 8) {
                    uVar67 = 0;
                    lVar38 = (long)local_278 * 4 + (uVar40 + local_1c8) * local_88 * 4;
                    lVar59 = (long)local_278 * 4 + (local_1c8 + uVar40 + 1) * local_88 * 4;
                  }
                  else {
                    iVar51 = 7;
                    lVar38 = 0;
                    pauVar52 = pauVar48;
                    do {
                      pauVar35 = pauVar52;
                      auVar2 = *(undefined1 (*) [32])((long)pd._vptr_ParamDict + lVar38 + lVar65);
                      auVar74 = *(undefined1 (*) [32])((long)pd._vptr_ParamDict + lVar38 + lVar56);
                      auVar76 = vunpcklps_avx(auVar2,auVar74);
                      auVar2 = vunpckhps_avx(auVar2,auVar74);
                      auVar74._16_16_ = auVar2._0_16_;
                      auVar74._0_16_ = auVar76._0_16_;
                      auVar2 = vperm2f128_avx(auVar76,auVar2,0x31);
                      pauVar52 = (undefined1 (*) [32])((long)*pauVar48 + lVar38 * 2);
                      *pauVar52 = auVar74;
                      pauVar52[1] = auVar2;
                      lVar38 = lVar38 + 0x20;
                      iVar51 = iVar51 + 8;
                      pauVar52 = pauVar52 + 2;
                    } while (iVar51 < (int)uVar49);
                    pauVar48 = pauVar35 + 2;
                    lVar59 = lVar38 + lVar56;
                    lVar38 = lVar38 + lVar65;
                    uVar67 = uVar49 & 0xfffffff8;
                  }
                  pauVar61 = (undefined1 (*) [16])((long)pd._vptr_ParamDict + lVar38);
                  pauVar57 = (undefined1 (*) [16])((long)pd._vptr_ParamDict + lVar59);
                  uVar32 = uVar67 | 3;
                  while ((int)uVar32 < (int)uVar49) {
                    auVar20 = vunpcklps_avx(*pauVar61,*pauVar57);
                    auVar72 = vunpckhps_avx(*pauVar61,*pauVar57);
                    *(undefined1 (*) [16])*pauVar48 = auVar20;
                    *(undefined1 (*) [16])((long)*pauVar48 + 0x10) = auVar72;
                    pauVar48 = pauVar48 + 1;
                    pauVar61 = pauVar61 + 1;
                    pauVar57 = pauVar57 + 1;
                    uVar32 = uVar67 + 7;
                    uVar67 = uVar67 + 4;
                  }
                  if ((int)uVar67 < (int)uVar49) {
                    lVar59 = 0;
                    do {
                      *(undefined4 *)*pauVar48 = *(undefined4 *)(*pauVar61 + lVar59 * 4);
                      *(undefined4 *)((long)*pauVar48 + 4) = *(undefined4 *)(*pauVar57 + lVar59 * 4)
                      ;
                      pauVar48 = (undefined1 (*) [32])((long)*pauVar48 + 8);
                      lVar59 = lVar59 + 1;
                    } while (local_27c - uVar67 != (int)lVar59);
                  }
                  uVar44 = uVar40 + 2;
                  lVar59 = uVar40 + 3;
                  lVar56 = lVar56 + local_88 * 8;
                  lVar65 = lVar65 + local_88 * 8;
                  uVar40 = uVar44;
                } while (lVar59 < (long)local_288);
              }
              if ((int)uVar44 < (int)local_26c) {
                uVar44 = (ulong)(int)uVar44;
                do {
                  pauVar52 = (undefined1 (*) [32])
                             ((long)pd._vptr_ParamDict +
                             (long)local_278 * 4 + (local_1c8 + uVar44) * local_88 * 4);
                  uVar67 = 0;
                  if (7 < (int)uVar49) {
                    iVar51 = 7;
                    do {
                      *pauVar48 = *pauVar52;
                      pauVar48 = pauVar48 + 1;
                      pauVar52 = pauVar52 + 1;
                      iVar51 = iVar51 + 8;
                      uVar67 = uVar49 & 0xfffffff8;
                    } while (iVar51 < (int)uVar49);
                  }
                  uVar32 = uVar67 | 3;
                  while ((int)uVar32 < (int)uVar49) {
                    *(undefined1 (*) [16])*pauVar48 = *(undefined1 (*) [16])*pauVar52;
                    pauVar48 = (undefined1 (*) [32])((long)*pauVar48 + 0x10);
                    pauVar52 = (undefined1 (*) [32])(*pauVar52 + 0x10);
                    uVar32 = uVar67 + 7;
                    uVar67 = uVar67 + 4;
                  }
                  if ((int)uVar67 < (int)uVar49) {
                    lVar56 = 0;
                    do {
                      *(undefined4 *)*pauVar48 = *(undefined4 *)(*pauVar52 + lVar56 * 4);
                      pauVar48 = (undefined1 (*) [32])((long)*pauVar48 + 4);
                      lVar56 = lVar56 + 1;
                    } while (local_27c - uVar67 != (int)lVar56);
                  }
                  uVar44 = uVar44 + 1;
                } while (uVar44 != local_288);
              }
              local_1b8 = local_1b8 + local_60;
              uVar44 = (ulong)(local_10c - uVar68);
              pp_Var34 = (_func_int **)((long)local_278 + local_128);
              local_50 = uVar45;
            } while ((long)local_278 + local_128 < local_58);
          }
          uVar45 = uVar45 + 1;
          local_100 = local_100 + local_78;
          local_b8 = local_b8 + local_78;
          local_c0 = local_c0 + local_78;
          local_c8 = local_c8 + local_78;
          local_d0 = local_d0 + local_78;
          local_d8 = local_d8 + local_78;
          local_e0 = local_e0 + local_78;
          local_e8 = local_e8 + local_78;
          local_138 = local_138 + lVar69;
          local_f0 = local_f0 + lVar69;
          local_f8 = local_f8 + lVar69;
          local_130 = local_130 + lVar69;
          local_68 = lVar69;
        } while (uVar45 != local_70);
      }
      piVar15 = (int *)CONCAT44(pd.d._4_4_,pd.d._0_4_);
      if (piVar15 != (int *)0x0) {
        LOCK();
        *piVar15 = *piVar15 + -1;
        UNLOCK();
        if (*piVar15 == 0) {
          if (local_238 == (Allocator *)0x0) {
            if (pd._vptr_ParamDict != (_func_int **)0x0) {
              lStack_290 = 0x203b5a;
              free(pd._vptr_ParamDict);
            }
          }
          else {
            lStack_290 = 0x203b48;
            (*local_238->_vptr_Allocator[3])();
          }
        }
      }
      local_218 = 0;
      pd._vptr_ParamDict = (_func_int **)0x0;
      pd.d._0_4_ = 0;
      pd.d._4_4_ = 0;
      uStack_244 = 0;
      local_240 = 0;
      iStack_230 = 0;
      iStack_22c = 0;
      uStack_228._0_4_ = 0;
      uStack_228._4_4_ = 0;
      local_220[0] = 0;
      if (local_268->lightmode != true) {
        return 0;
      }
      piVar15 = (pCVar27->super_Convolution).weight_data.refcount;
      if (piVar15 != (int *)0x0) {
        LOCK();
        *piVar15 = *piVar15 + -1;
        UNLOCK();
        if (*piVar15 == 0) {
          pvVar16 = (pCVar27->super_Convolution).weight_data.data;
          pAVar17 = (pCVar27->super_Convolution).weight_data.allocator;
          if (pAVar17 == (Allocator *)0x0) {
            if (pvVar16 != (void *)0x0) {
              lStack_290 = 0x203be6;
              free(pvVar16);
            }
          }
          else {
            lStack_290 = 0x203bbe;
            (*pAVar17->_vptr_Allocator[3])();
          }
        }
      }
      (pCVar27->super_Convolution).weight_data.cstep = 0;
      *(undefined1 (*) [16])((long)&local_80->refcount + 4) = (undefined1  [16])0x0;
      local_80->data = (void *)0x0;
      local_80->refcount = (int *)0x0;
      (pCVar27->super_Convolution).weight_data.dims = 0;
      (pCVar27->super_Convolution).weight_data.w = 0;
      (pCVar27->super_Convolution).weight_data.h = 0;
      (pCVar27->super_Convolution).weight_data.d = 0;
      (pCVar27->super_Convolution).weight_data.c = 0;
      return 0;
    }
    uVar31 = uVar68 ^ 8;
    out_elempack = (uint)lVar69;
    uVar54 = out_elempack ^ 8;
    if (((iVar51 != 1 || uVar37 != 1) ||
        ((uVar32 != 1 || uVar67 != 3) || (uVar49 != 3 || (uVar31 != 0 || uVar54 != 0)))) ||
        iVar46 != 1) {
      local_278 = (_func_int **)CONCAT71(local_278._1_7_,iVar46 == 1);
      if (iVar46 != 1 ||
          ((uVar37 != 1 || iVar51 != 1) ||
          ((uVar67 != 2 || uVar32 != 1) || ((uVar31 != 0 || uVar54 != 0) || uVar49 != 2)))) {
        uVar37 = uVar37 ^ 1;
        uVar32 = uVar32 ^ 1;
        uVar58 = uVar67 ^ 3;
        uVar62 = uVar49 ^ 3;
        uVar53 = uVar68 ^ 1;
        if ((((iVar51 != 1 ||
              ((((uVar54 != 0 || uVar53 != 0) || uVar62 != 0) || (uVar58 != 0 || uVar32 != 0)) ||
              uVar37 != 0)) || iVar46 != 1) &&
            ((((((uVar54 != 0 || uVar53 != 0) || uVar62 != 0) || (uVar58 != 0 || uVar32 != 0)) ||
              uVar37 != 0) || iVar51 != 2) || iVar46 != 2)) &&
           (((iVar51 != 1 || uVar37 != 0) ||
            (((uVar31 != 0 || out_elempack != 1) || uVar62 != 0) || (uVar58 != 0 || uVar32 != 0)))
            || iVar46 != 1)) {
          if (((iVar51 != 1 ||
               ((((uVar53 != 0 || out_elempack != 4) || uVar62 != 0) || (uVar58 != 0 || uVar32 != 0)
                ) || uVar37 != 0)) || iVar46 != 1) &&
             (((((uVar53 != 0 || out_elempack != 4) || uVar62 != 0) || (uVar58 != 0 || uVar32 != 0))
              || uVar37 != 0) || (iVar51 != 2 || iVar46 != 2))) {
            lStack_290 = 0x204086;
            convolution_transform_kernel_packed
                      (&(this->super_Convolution).weight_data,&this->weight_data_tm,(int)local_288,
                       uVar7,uVar49,uVar67);
            goto LAB_00202c65;
          }
        }
      }
    }
    lStack_290 = lVar69;
    convolution_transform_kernel_packed_sse
              (&(this->super_Convolution).weight_data,&this->weight_data_tm,(int)local_288,uVar7,
               uVar49,uVar67,uVar68,out_elempack);
LAB_00202c65:
    if (local_268->lightmode == true) {
      piVar15 = (this->super_Convolution).weight_data.refcount;
      if (piVar15 != (int *)0x0) {
        LOCK();
        *piVar15 = *piVar15 + -1;
        UNLOCK();
        if (*piVar15 == 0) {
          pvVar16 = (this->super_Convolution).weight_data.data;
          pAVar17 = (this->super_Convolution).weight_data.allocator;
          if (pAVar17 == (Allocator *)0x0) {
            if (pvVar16 != (void *)0x0) {
              lStack_290 = 0x203ee2;
              free(pvVar16);
            }
          }
          else {
            lStack_290 = 0x202cb0;
            (*pAVar17->_vptr_Allocator[3])();
          }
        }
      }
      (this->super_Convolution).weight_data.cstep = 0;
      *(undefined1 (*) [16])((long)&(this->super_Convolution).weight_data.refcount + 4) =
           (undefined1  [16])0x0;
      (this->super_Convolution).weight_data.data = (void *)0x0;
      (this->super_Convolution).weight_data.refcount = (int *)0x0;
      (this->super_Convolution).weight_data.dims = 0;
      (this->super_Convolution).weight_data.w = 0;
      (this->super_Convolution).weight_data.h = 0;
      (this->super_Convolution).weight_data.d = 0;
      (this->super_Convolution).weight_data.c = 0;
    }
    return 0;
  }
  pMVar13 = (this->super_Convolution).super_Layer.bottom_shapes.
            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (((pMVar13 ==
        (this->super_Convolution).super_Layer.bottom_shapes.
        super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.super__Vector_impl_data.
        _M_finish) || ((pMVar13->w == 0 || (pMVar13->h == 0)))) &&
     ((pMVar14 = (this->super_Convolution).super_Layer.top_shapes.
                 super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                 super__Vector_impl_data._M_start,
      pMVar14 ==
      (this->super_Convolution).super_Layer.top_shapes.
      super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.super__Vector_impl_data.
      _M_finish || ((pMVar14->w == 0 || (pMVar14->h == 0)))))) {
    if (((0x20 < (int)uVar7) || (opt->use_winograd63_convolution == false)) || (0x20 < iVar51)) {
      if (opt->use_winograd43_convolution == true) {
LAB_00202ccb:
        pOVar47 = local_268;
        lStack_290 = 0x202ce0;
        conv3x3s1_winograd43_transform_kernel
                  (&(this->super_Convolution).weight_data,&this->weight_winograd43_data,
                   (int)local_288,uVar7,local_268);
        goto LAB_00202ce0;
      }
LAB_00202b02:
      pOVar47 = local_268;
      lStack_290 = 0x202b17;
      conv3x3s1_winograd23_transform_kernel
                (&(this->super_Convolution).weight_data,&this->weight_winograd23_data,(int)local_288
                 ,uVar7,local_268);
      goto LAB_00202ce0;
    }
  }
  else {
    pMVar14 = (this->super_Convolution).super_Layer.top_shapes.
              super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
              super__Vector_impl_data._M_start;
    local_278 = (_func_int **)CONCAT71(local_278._1_7_,opt->use_winograd23_convolution);
    if ((pMVar14 ==
         (this->super_Convolution).super_Layer.top_shapes.
         super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.super__Vector_impl_data.
         _M_finish) || ((iVar46 = pMVar14->w, iVar46 == 0 || (iVar66 = pMVar14->h, iVar66 == 0)))) {
      iVar46 = pMVar13->w;
      iVar66 = pMVar13->h;
      iVar8 = (this->super_Convolution).pad_left;
      if ((iVar8 < 1) &&
         (((iVar9 = (this->super_Convolution).pad_right, iVar9 < 1 &&
           (iVar10 = (this->super_Convolution).pad_top, iVar10 < 1)) &&
          (iVar11 = (this->super_Convolution).pad_bottom, iVar11 < 1)))) {
        if ((iVar11 == -0xe9 && (iVar10 == -0xe9 && (iVar9 == -0xe9 && iVar8 == -0xe9))) ||
           (iVar11 == -0xea && (iVar10 == -0xea && (iVar9 == -0xea && iVar8 == -0xea))))
        goto LAB_002024f2;
      }
      else {
        iVar46 = iVar8 + iVar46 + (this->super_Convolution).pad_right;
        iVar66 = iVar66 + (this->super_Convolution).pad_top + (this->super_Convolution).pad_bottom;
      }
    }
    else {
LAB_002024f2:
      iVar46 = iVar46 + 2;
      iVar66 = iVar66 + 2;
    }
    lStack_290 = 0x202a89;
    bVar28 = test_prefer_winograd63(iVar51,uVar7,iVar46,iVar66);
    lStack_290 = 0x202a9c;
    bVar29 = test_prefer_winograd23(iVar51,uVar7,iVar46,iVar66);
    bVar36 = bVar29 & (byte)local_278;
    bVar39 = (byte)local_278;
    if (!bVar29) {
      bVar39 = bVar28;
    }
    bVar30 = bVar28 & local_268->use_winograd63_convolution;
    bVar39 = (local_268->use_winograd63_convolution ^ 1U) & bVar28 | bVar39 ^ 1;
    if ((bVar39 == 1) && (local_268->use_winograd43_convolution == false)) {
      bVar30 = bVar30 | local_268->use_winograd63_convolution;
      bVar36 = bVar36 | local_268->use_winograd63_convolution ^ 1U;
      bVar39 = 0;
    }
    if (bVar36 != 0) goto LAB_00202b02;
    if (bVar39 != 0) goto LAB_00202ccb;
    pOVar47 = local_268;
    if ((bVar30 & 1) == 0) goto LAB_00202ce0;
  }
  pOVar47 = local_268;
  lStack_290 = 0x202703;
  conv3x3s1_winograd63_transform_kernel
            (&(this->super_Convolution).weight_data,&this->weight_winograd63_data,(int)local_288,
             uVar7,local_268);
LAB_00202ce0:
  if (pOVar47->lightmode != true) {
    return 0;
  }
  piVar15 = (this->super_Convolution).weight_data.refcount;
  if (piVar15 != (int *)0x0) {
    LOCK();
    *piVar15 = *piVar15 + -1;
    UNLOCK();
    if (*piVar15 == 0) {
      pvVar16 = (this->super_Convolution).weight_data.data;
      pAVar17 = (this->super_Convolution).weight_data.allocator;
      if (pAVar17 == (Allocator *)0x0) {
        if (pvVar16 != (void *)0x0) {
          lStack_290 = 0x202dbd;
          free(pvVar16);
        }
      }
      else {
        lStack_290 = 0x202d26;
        (*pAVar17->_vptr_Allocator[3])();
      }
    }
  }
  (this->super_Convolution).weight_data.cstep = 0;
  *(undefined1 (*) [16])((long)&(this->super_Convolution).weight_data.refcount + 4) =
       (undefined1  [16])0x0;
  (this->super_Convolution).weight_data.data = (void *)0x0;
  (this->super_Convolution).weight_data.refcount = (int *)0x0;
  (this->super_Convolution).weight_data.dims = 0;
  (this->super_Convolution).weight_data.w = 0;
  (this->super_Convolution).weight_data.h = 0;
  (this->super_Convolution).weight_data.d = 0;
  (this->super_Convolution).weight_data.c = 0;
  return 0;
}

Assistant:

int Convolution_x86_avx::create_pipeline(const Option& opt)
{
    if (dynamic_weight)
        return 0;

    activation = create_activation_layer(activation_type, activation_params, opt);
    nT = opt.num_threads;

#if NCNN_INT8
    if (opt.use_int8_inference && weight_data.elemsize == (size_t)1u)
    {
        return create_pipeline_int8_x86(opt);
    }
#endif

    int kernel_size = kernel_w * kernel_h;
    int num_input = weight_data_size / kernel_size / num_output;

    if (!opt.use_packing_layout && kernel_w == kernel_h && dilation_w != 1 && dilation_h == dilation_w && stride_w == 1 && stride_h == 1)
    {
        convolution_dilation1 = ncnn::create_layer_cpu(ncnn::LayerType::Convolution);

        // set param
        ncnn::ParamDict pd;
        pd.set(0, num_output); // num_output
        pd.set(1, kernel_w);
        pd.set(11, kernel_h);
        pd.set(2, 1);
        pd.set(12, 1);
        pd.set(3, 1);  // stride_w
        pd.set(13, 1); // stride_h
        pd.set(4, 0);  // pad_w
        pd.set(14, 0); // pad_h
        pd.set(5, bias_term);
        pd.set(6, weight_data_size);

        convolution_dilation1->load_param(pd);

        // set weights
        if (bias_term)
        {
            ncnn::Mat weights[2];
            weights[0] = weight_data;
            weights[1] = bias_data;

            convolution_dilation1->load_model(ModelBinFromMatArray(weights));
        }
        else
        {
            ncnn::Mat weights[1];
            weights[0] = weight_data;

            convolution_dilation1->load_model(ModelBinFromMatArray(weights));
        }

        convolution_dilation1->create_pipeline(opt);

        if (opt.lightmode)
            weight_data.release();

        return 0;
    }

    int elempack = 1;
    int out_elempack = 1;

#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        elempack = num_input % 16 == 0 ? 16 : num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        elempack = num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        elempack = num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

    bool prefer_winograd = (opt.use_winograd23_convolution || opt.use_winograd43_convolution || opt.use_winograd63_convolution) && (num_input > 8 || num_output > 8);

    if (opt.use_winograd_convolution && prefer_winograd && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
    {
        if ((bottom_shapes.empty() || bottom_shapes[0].w == 0 || bottom_shapes[0].h == 0) && (top_shapes.empty() || top_shapes[0].w == 0 || top_shapes[0].h == 0))
        {
            // dynamic shape
            if ((opt.use_winograd63_convolution) && (num_input <= 32 && num_output <= 32))
                conv3x3s1_winograd63_transform_kernel(weight_data, weight_winograd63_data, num_input, num_output, opt);
            else if (opt.use_winograd43_convolution)
                conv3x3s1_winograd43_transform_kernel(weight_data, weight_winograd43_data, num_input, num_output, opt);
            else
                conv3x3s1_winograd23_transform_kernel(weight_data, weight_winograd23_data, num_input, num_output, opt);
        }
        else
        {
            int w;
            int h;
            if (top_shapes.empty() || top_shapes[0].w == 0 || top_shapes[0].h == 0)
            {
                w = bottom_shapes[0].w;
                h = bottom_shapes[0].h;

                // make padding
                if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0)
                {
                    w += pad_left + pad_right;
                    h += pad_top + pad_bottom;
                }
                else if ((pad_left == -233 && pad_right == -233 && pad_top == -233 && pad_bottom == -233)
                         || (pad_left == -234 && pad_right == -234 && pad_top == -234 && pad_bottom == -234))
                {
                    // tensorflow padding=SAME or onnx padding=SAME_UPPER/SAME_LOWER
                    w += 2;
                    h += 2;
                }
            }
            else
            {
                w = top_shapes[0].w + 2;
                h = top_shapes[0].h + 2;
            }

            bool prefer_winograd63 = test_prefer_winograd63(num_input, num_output, w, h);
            bool prefer_winograd23 = test_prefer_winograd23(num_input, num_output, w, h);
            bool prefer_winograd43 = !prefer_winograd63 && !prefer_winograd23;

            if (prefer_winograd23 && !opt.use_winograd23_convolution)
            {
                // f23 fallback to f43
                prefer_winograd23 = false;
                prefer_winograd43 = true;
            }

            if (prefer_winograd63 && !opt.use_winograd63_convolution)
            {
                // f63 fallback to f43
                prefer_winograd63 = false;
                prefer_winograd43 = true;
            }

            if (prefer_winograd43 && !opt.use_winograd43_convolution)
            {
                // f43 fallback to f63 or f23
                prefer_winograd43 = false;
                if (opt.use_winograd63_convolution)
                {
                    prefer_winograd63 = true;
                }
                else
                {
                    prefer_winograd23 = true;
                }
            }

            if (prefer_winograd23)
            {
                conv3x3s1_winograd23_transform_kernel(weight_data, weight_winograd23_data, num_input, num_output, opt);
            }
            else if (prefer_winograd43)
            {
                conv3x3s1_winograd43_transform_kernel(weight_data, weight_winograd43_data, num_input, num_output, opt);
            }
            else if (prefer_winograd63)
            {
                conv3x3s1_winograd63_transform_kernel(weight_data, weight_winograd63_data, num_input, num_output, opt);
            }
            else
            {
                // should never reach here
            }
        }

        if (opt.lightmode)
            weight_data.release();

        return 0;
    }

    int l2_cache_size = get_cpu_level2_cache_size();
    bool prefer_sgemm = num_input * num_output * kernel_w * kernel_h * dilation_w * dilation_h * stride_w * stride_h * (int)sizeof(float) * 2 > l2_cache_size || (num_input > 16 || num_output > 16);

    if ((opt.use_sgemm_convolution && prefer_sgemm) || (kernel_w == 1 && kernel_h == 1))
    {
        convolution_im2col_gemm_transform_kernel(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h, opt);

        if (opt.lightmode)
            weight_data.release();

        return 0;
    }

    if ((elempack == 16 && out_elempack == 1 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            || (elempack == 8 && out_elempack == 8 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            || (elempack == 8 && out_elempack == 8 && kernel_w == 2 && kernel_h == 2 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            || (elempack == 1 && out_elempack == 8 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            || (elempack == 1 && out_elempack == 8 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            || (elempack == 8 && out_elempack == 1 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            || (elempack == 1 && out_elempack == 4 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            || (elempack == 1 && out_elempack == 4 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2))
    {
        convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
    }
    else
    {
        convolution_transform_kernel_packed(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h);
    }

    if (opt.lightmode)
        weight_data.release();

    return 0;
}